

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O0

void __thiscall
PlatformWindowData::loop<std::function<void()>&>(PlatformWindowData *this,function<void_()> *step)

{
  Display *pDVar1;
  int iVar2;
  rep rVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  XEvent in_stack_fffffffffffffb58;
  double local_3d8;
  byte local_3c9;
  undefined4 local_398 [2];
  XEvent ev;
  duration<long,_std::ratio<1L,_1000000L>_> local_2d0;
  double local_2c8;
  double dt;
  double local_2b8;
  double limit;
  duration<long,_std::ratio<1L,_1000000000L>_> local_2a8;
  duration<long,_std::ratio<1L,_1000000L>_> local_2a0;
  long local_298;
  undefined8 local_290 [24];
  bool local_1c9;
  bool wasResize;
  int local_108 [2];
  XEvent e;
  anon_class_8_1_8991fb9c sendExposeEvent;
  long nredrawproc;
  long nredraw;
  time_point trsz;
  time_point t1;
  time_point t0;
  function<void_()> *step_local;
  PlatformWindowData *this_local;
  
  bVar7 = 0;
  nredraw = std::chrono::_V2::system_clock::now();
  trsz.__d.__r = (duration)(duration)nredraw;
  t1.__d.__r = (duration)(duration)nredraw;
  printf("Entering event loop\n");
  nredrawproc = 0;
  sendExposeEvent.this = (PlatformWindowData *)0x0;
  e.pad[0x17] = (long)this;
  XMoveResizeWindow(this->display,this->handle,(this->last_pos).x,(this->last_pos).y,
                    (this->last_size).w,(this->last_size).h);
  do {
    if ((this->eventDriven & 1U) == 0) {
      while (iVar2 = XEventsQueued(this->display,0), 0 < iVar2) {
        XNextEvent(this->display);
        if (local_108[0] == 0x21) {
          if (e.xany.serial._0_4_ == 0) {
            printf("[%zi] Not sent CM ");
          }
          if (e.xany.window == this->AWM_PROTOCOLS) {
            if (e.xkey.subwindow == this->AWM_DELETE_WINDOW) {
              this->isQuit = true;
              std::function<void_()>::operator()
                        ((function<void_()> *)(MainWindowDetails::relay + 0x58));
              break;
            }
            printf("Unknown protocol message %zi\n");
          }
          else if (e.xany.window == 0x67932) {
            sendExposeEvent.this = (PlatformWindowData *)e.xkey.subwindow;
          }
          else {
            printf("Other Atom %zi ");
          }
        }
        else {
          local_1c9 = false;
          pDVar1 = this->display;
          memcpy(local_290,local_108,0xc0);
          puVar5 = local_290;
          puVar6 = (undefined8 *)&stack0xfffffffffffffb58;
          for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
            *puVar6 = *puVar5;
            puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
            puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
          }
          MainWindowDetails::Proc
                    (pDVar1,&this->handle,in_stack_fffffffffffffb58,&this->size,&local_1c9);
          if ((local_1c9 & 1U) != 0) {
            this->isResizing = true;
            local_298 = std::chrono::_V2::system_clock::now();
            nredraw = local_298;
          }
        }
      }
      this->needRedraw = true;
    }
    else {
      XNextEvent(this->display,local_108);
      if (((local_108[0] == 0x21) && (e.xany.window == this->AWM_PROTOCOLS)) &&
         (e.xkey.subwindow == this->AWM_DELETE_WINDOW)) {
        this->isQuit = true;
        std::function<void_()>::operator()((function<void_()> *)(MainWindowDetails::relay + 0x58));
        return;
      }
      pDVar1 = this->display;
      memcpy(&stack0xfffffffffffffe38,local_108,0xc0);
      puVar5 = (undefined8 *)&stack0xfffffffffffffe38;
      puVar6 = (undefined8 *)&stack0xfffffffffffffb58;
      for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar6 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
      }
      MainWindowDetails::Proc
                (pDVar1,&this->handle,in_stack_fffffffffffffb58,&this->size,&this->isResizing);
      this->needRedraw = true;
    }
    limit = (double)std::chrono::_V2::system_clock::now();
    local_2a8.__r =
         (rep)std::chrono::operator-
                        ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&limit,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&nredraw);
    local_2a0.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_2a8);
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_2a0);
    if (300.0 < (double)rVar3 / 1000.0) {
      this->isResizing = false;
      this->needRedraw = true;
    }
    if ((this->needRedraw & 1U) != 0) {
      local_3c9 = 1;
      if ((this->isResizing & 1U) == 0) {
        local_3c9 = this->eventDriven;
      }
      local_3d8 = 250.0;
      if ((local_3c9 & 1) == 0) {
        local_3d8 = 1.0;
      }
      local_2b8 = local_3d8;
      dt = (double)std::chrono::_V2::system_clock::now();
      trsz.__d.__r = (duration)(duration)dt;
      ev.pad[0x17] = (long)std::chrono::operator-(&trsz,&t1);
      local_2d0.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)(ev.pad + 0x17));
      rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_2d0);
      local_2c8 = (double)rVar3 / 1000.0;
      if (local_2b8 < local_2c8) {
        if ((((this->eventDriven & 1U) == 0) && ((this->eventDriven & 1U) == 0)) &&
           ((PlatformWindowData *)nredrawproc == sendExposeEvent.this)) {
          std::function<void_()>::operator()(step);
          loop<std::function<void_()>_&>::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)(e.pad + 0x17));
          nredrawproc = nredrawproc + 1;
          memset(local_398,0,0xc0);
          local_398[0] = 0x21;
          ev.xfocus.mode = 0x20;
          ev.xany.display = (Display *)this->handle;
          ev.xany.window = 0x67932;
          ev.pad[6] = nredrawproc;
          XSendEvent(this->display,this->handle,0,0,local_398);
          XSync(this->display);
        }
        t1 = trsz;
        this->needRedraw = false;
      }
    }
    if ((this->isQuit & 1U) != 0) {
      return;
    }
  } while( true );
}

Assistant:

void loop(F&& step)
	{
		auto t0 = std::chrono::high_resolution_clock::now();
		auto t1 = t0, trsz = t0;
		printf("Entering event loop\n");
		long nredraw = 0, nredrawproc = 0;

		auto sendExposeEvent = [&]()
		{
			XExposeEvent xee{};
			xee.type = Expose;
			xee.send_event = True;
			xee.display = display;
			xee.window = handle;
			XSendEvent(display, handle, False, NoEventMask, (XEvent*)&xee);
		};

		//Reposition the window, because some WMs move the window initially despite the x, y, set in create window.
		XMoveResizeWindow(display, handle, last_pos.x, last_pos.y, last_size.w, last_size.h);
		while(true)
		{
			XEvent e;
			if(eventDriven)
			{
				XNextEvent(display, &e);
				if(e.type == ClientMessage && e.xclient.message_type == AWM_PROTOCOLS && (Atom)(e.xclient.data.l[0]) == AWM_DELETE_WINDOW){ isQuit = true; MainWindowDetails::relay.onExit(); break; }
				else{ MainWindowDetails::Proc(display, handle, e, size, isResizing); }
				//step();
				//printf("while 1\n");
				needRedraw = true;
			}
			else
			{
				//auto res = True;
				//while(res == True && !isQuit)
				{
					while(XEventsQueued(display, QueuedAlready) > 0)
					{
						XNextEvent(display, &e);
						if(e.type == ClientMessage)
						{
							if(e.xclient.send_event){ /*printf("[%zi] Sent CM ", e.xclient.serial);*/ }
							else{ printf("[%zi] Not sent CM ", e.xclient.serial); }

							if(e.xclient.message_type == AWM_PROTOCOLS)
							{
								//printf("WM_PROTOCOLS ");
								if( (Atom)(e.xclient.data.l[0]) == AWM_DELETE_WINDOW){ /*printf("AWM_DELETE_WINDOW\n");*/ isQuit = true; MainWindowDetails::relay.onExit(); break; }
								else{ printf("Unknown protocol message %zi\n", e.xclient.data.l[0]); }
							}
							else if(e.xclient.message_type == 424242){ nredrawproc = e.xclient.data.l[0]; /*printf("Redraw processed: %zi\n", nredrawproc);*/ }
							else{ printf("Other Atom %zi ", e.xclient.message_type); }
						}
						else
						{
							bool wasResize = false;
							MainWindowDetails::Proc(display, handle, e, size, wasResize);
							if(wasResize){ isResizing = true; trsz = std::chrono::high_resolution_clock::now(); }
						}
					}
					needRedraw = true;
				}
			}

			if(std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::high_resolution_clock::now()-trsz).count()/1000.0 > 300.0)
			{
				//printf("isResizing = false\n");
				isResizing = false;
				needRedraw = true;
			}

			if(needRedraw)
			{
				double limit = (isResizing || eventDriven) ? 250.0 : 1.0;
				t1 = std::chrono::high_resolution_clock::now();
				auto dt = std::chrono::duration_cast<std::chrono::microseconds>(t1-t0).count()/1000.0;
				if(dt > limit)
				{
					if(eventDriven){ /*printf("limited redraw, expose event, dt = %f\n", dt); sendExposeEvent();*//*XClearArea(display, handle, 0, 0, 1, 1, true);*/ }
					else if(!eventDriven && (nredraw == nredrawproc))
					{
						step();
						sendExposeEvent();//XClearArea(display, handle, 0, 0, 1, 1, true);
						nredraw += 1;
						XEvent ev{0};
						ev.type = ClientMessage;
						ev.xclient.format = 32;
						ev.xclient.window = handle;
						ev.xclient.message_type = 424242;
						ev.xclient.data.l[0] = nredraw;
						XSendEvent(display, handle, False, NoEventMask, &ev);
						XSync(display, False);
						//XFlush(display);
					}
					t0 = t1;
					needRedraw = false;
				}
			}
			//
			//
			if(isQuit){ break; }
		}
	}